

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

void __thiscall QFileSystemMetaData::fillFromStatBuf(QFileSystemMetaData *this,stat64 *statBuffer)

{
  long lVar1;
  MetaDataFlags other;
  QFlags<QFileSystemMetaData::MetaDataFlag> other_00;
  type_conflict2 tVar2;
  qint64 qVar3;
  stat64 *in_RSI;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_RDI;
  long in_FS_OFFSET;
  quint64 attributes;
  MetaDataFlags flags;
  MetaDataFlag in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = flagsFromStMode((mode_t)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
            (in_RDI + 1,
             (QFlags<QFileSystemMetaData::MetaDataFlag>)
             other.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
  other_00 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                       ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDI,other_00);
  if (in_RSI->st_nlink == 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDI + 1,WasDeletedAttribute);
  }
  *(__off_t *)(in_RDI + 2) = in_RSI->st_size;
  uVar4 = 0;
  tVar2 = anon_unknown.dwarf_3e8e73::GetFileTimes::atime<stat64>
                    ((stat64 *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  *(type_conflict2 *)(in_RDI + 4) = tVar2;
  qVar3 = anon_unknown.dwarf_3e8e73::GetFileTimes::birthtime(in_RSI,(ulong)uVar4);
  *(qint64 *)(in_RDI + 6) = qVar3;
  tVar2 = anon_unknown.dwarf_3e8e73::GetFileTimes::ctime<stat64>
                    ((stat64 *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  *(type_conflict2 *)(in_RDI + 8) = tVar2;
  tVar2 = anon_unknown.dwarf_3e8e73::GetFileTimes::mtime<stat64>
                    ((stat64 *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  *(type_conflict2 *)(in_RDI + 10) = tVar2;
  in_RDI[0xc].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = in_RSI->st_uid;
  in_RDI[0xd].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = in_RSI->st_gid;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemMetaData::fillFromStatBuf(const QT_STATBUF &statBuffer)
{
    quint64 attributes = 0;
#if defined(UF_SETTABLE)        // BSDs (incl. Darwin)
    attributes = statBuffer.st_flags;
#elif defined(Q_OS_VXWORKS) && __has_include(<dosFsLib.h>)
    attributes = statBuffer.st_attrib;
#endif
    // Permissions
    MetaDataFlags flags = flagsFromStMode(statBuffer.st_mode, attributes);
    entryFlags |= flags;
    knownFlagsMask |= flags | PosixStatFlags;

    // Attributes
    if (statBuffer.st_nlink == 0)
        entryFlags |= QFileSystemMetaData::WasDeletedAttribute;
    size_ = statBuffer.st_size;

    // Times
    accessTime_ = GetFileTimes::atime(statBuffer, 0);
    birthTime_ = GetFileTimes::birthtime(statBuffer, 0);
    metadataChangeTime_ = GetFileTimes::ctime(statBuffer, 0);
    modificationTime_ = GetFileTimes::mtime(statBuffer, 0);

    userId_ = statBuffer.st_uid;
    groupId_ = statBuffer.st_gid;
}